

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundReferenceExpression::Deserialize
          (BoundReferenceExpression *this,Deserializer *deserializer)

{
  int iVar1;
  storage_t index;
  BoundReferenceExpression *this_00;
  LogicalType return_type;
  LogicalType local_50;
  LogicalType local_38;
  undefined4 extraout_var;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_50,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"index");
  if ((char)iVar1 == '\0') {
    index = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    index = CONCAT44(extraout_var,iVar1);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_38,&local_50);
  BoundReferenceExpression(this_00,&local_38,index);
  LogicalType::~LogicalType(&local_38);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&local_50);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundReferenceExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(201, "index");
	auto result = duckdb::unique_ptr<BoundReferenceExpression>(new BoundReferenceExpression(std::move(return_type), index));
	return std::move(result);
}